

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

idx_t duckdb::BinaryExecutor::SelectFlat<double,_double,_duckdb::GreaterThanEquals,_false,_false>
                (Vector *left,Vector *right,SelectionVector *sel,idx_t count,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  SelectionVector *false_sel_00;
  ValidityMask *mask;
  idx_t iVar1;
  idx_t in_RCX;
  ValidityMask *in_RDX;
  ValidityMask *in_RSI;
  ValidityMask combined_mask;
  double *rdata;
  double *ldata;
  ValidityMask *in_stack_ffffffffffffff78;
  SelectionVector *in_stack_ffffffffffffff80;
  idx_t in_stack_ffffffffffffff90;
  SelectionVector *in_stack_ffffffffffffff98;
  double *in_stack_ffffffffffffffa0;
  double *in_stack_ffffffffffffffa8;
  
  FlatVector::GetData<double>((Vector *)0x2f210e5);
  false_sel_00 = (SelectionVector *)FlatVector::GetData<double>((Vector *)0x2f210f4);
  FlatVector::Validity((Vector *)0x2f21106);
  ValidityMask::ValidityMask((ValidityMask *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  mask = FlatVector::Validity((Vector *)0x2f2111d);
  ValidityMask::Combine(in_RSI,in_RDX,in_RCX);
  iVar1 = SelectFlatLoopSwitch<double,_double,_duckdb::GreaterThanEquals,_false,_false>
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffff90,mask,in_stack_ffffffffffffff80,false_sel_00);
  ValidityMask::~ValidityMask((ValidityMask *)0x2f21179);
  return iVar1;
}

Assistant:

static idx_t SelectFlat(Vector &left, Vector &right, const SelectionVector *sel, idx_t count,
	                        SelectionVector *true_sel, SelectionVector *false_sel) {
		auto ldata = FlatVector::GetData<LEFT_TYPE>(left);
		auto rdata = FlatVector::GetData<RIGHT_TYPE>(right);

		if (LEFT_CONSTANT && ConstantVector::IsNull(left)) {
			if (false_sel) {
				for (idx_t i = 0; i < count; i++) {
					false_sel->set_index(i, sel->get_index(i));
				}
			}
			return 0;
		}
		if (RIGHT_CONSTANT && ConstantVector::IsNull(right)) {
			if (false_sel) {
				for (idx_t i = 0; i < count; i++) {
					false_sel->set_index(i, sel->get_index(i));
				}
			}
			return 0;
		}

		if (LEFT_CONSTANT) {
			return SelectFlatLoopSwitch<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT>(
			    ldata, rdata, sel, count, FlatVector::Validity(right), true_sel, false_sel);
		} else if (RIGHT_CONSTANT) {
			return SelectFlatLoopSwitch<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT>(
			    ldata, rdata, sel, count, FlatVector::Validity(left), true_sel, false_sel);
		} else {
			ValidityMask combined_mask = FlatVector::Validity(left);
			combined_mask.Combine(FlatVector::Validity(right), count);
			return SelectFlatLoopSwitch<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT>(
			    ldata, rdata, sel, count, combined_mask, true_sel, false_sel);
		}
	}